

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TernaryExpression.hpp
# Opt level: O3

bool __thiscall Kandinsky::TernaryExpression::isConstant(TernaryExpression *this)

{
  int iVar1;
  
  iVar1 = (*((this->m_arg1).
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_BaseExpression[6])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*((this->m_arg2).
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_BaseExpression[6])();
    if ((char)iVar1 != '\0') {
      iVar1 = (*((this->m_arg3).
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_BaseExpression[6])();
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

virtual bool isConstant() const
        {
            return m_arg1->isConstant() && m_arg2->isConstant() && m_arg3->isConstant();
        }